

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  bool bVar1;
  size_type sVar2;
  Column *in_RSI;
  Column *in_RDI;
  Column *col;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *__range2;
  value_type *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff98;
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
  local_30;
  Column *local_28;
  
  *(Column **)&(in_RDI->m_string).m_string = in_RSI;
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::vector((vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
            *)0x1972bd);
  sVar2 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                    ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
                     *(Column **)&(in_RDI->m_string).m_string);
  (in_RDI->m_string).m_size = sVar2;
  std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
            ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
             *(Column **)&(in_RDI->m_string).m_string);
  std::
  vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
  ::reserve(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_28 = *(Column **)&(in_RDI->m_string).m_string;
  local_30._M_current =
       (Column *)
       std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::begin
                 ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
                  in_stack_ffffffffffffff68);
  std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::end
            ((vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *)
             in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
    ::operator*(&local_30);
    in_stack_ffffffffffffff68 = (value_type *)&(in_RDI->m_string).m_string._M_string_length;
    Column::begin(in_RDI);
    std::
    vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
    ::push_back((vector<Catch::TextFlow::Column::const_iterator,_std::allocator<Catch::TextFlow::Column::const_iterator>_>
                 *)in_RDI,in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

Columns::iterator::iterator( Columns const& columns ):
            m_columns( columns.m_columns ),
            m_activeIterators( m_columns.size() ) {

            m_iterators.reserve( m_columns.size() );
            for ( auto const& col : m_columns ) {
                m_iterators.push_back( col.begin() );
            }
        }